

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,uint64 value,uint64 fixed_size)

{
  int32 iVar1;
  IMkvWriter *in_RCX;
  uint64 in_RDX;
  IMkvWriter *in_RSI;
  long in_RDI;
  uint64 size;
  IMkvWriter *value_00;
  bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    iVar1 = WriteID(in_RSI,in_RDX);
    if (iVar1 == 0) {
      iVar1 = GetUIntSize(in_RDX);
      value_00 = (IMkvWriter *)(long)iVar1;
      if ((in_RCX == (IMkvWriter *)0x0) || (value_00 = in_RCX, (IMkvWriter *)(long)iVar1 <= in_RCX))
      {
        iVar1 = WriteUInt(in_RCX,(uint64)value_00);
        if (iVar1 == 0) {
          iVar1 = SerializeInt(in_RSI,in_RDX,(int32)((ulong)in_RCX >> 0x20));
          if (iVar1 == 0) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, uint64 value,
                      uint64 fixed_size) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  uint64 size = GetUIntSize(value);
  if (fixed_size > 0) {
    if (size > fixed_size)
      return false;
    size = fixed_size;
  }
  if (WriteUInt(writer, size))
    return false;

  if (SerializeInt(writer, value, static_cast<int32>(size)))
    return false;

  return true;
}